

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_internal.h
# Opt level: O0

void absl::lts_20250127::cord_internal::CordRepExternal::Delete(CordRep *rep)

{
  long lVar1;
  bool local_19;
  CordRepExternal *rep_external;
  CordRep *rep_local;
  
  local_19 = false;
  if (rep != (CordRep *)0x0) {
    local_19 = CordRep::IsExternal(rep);
  }
  if (local_19 == false) {
    __assert_fail("rep != nullptr && rep->IsExternal()",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/cord_internal.h"
                  ,0x1b5,"static void absl::cord_internal::CordRepExternal::Delete(CordRep *)");
  }
  lVar1._0_4_ = rep[1].refcount;
  lVar1._4_1_ = rep[1].tag;
  lVar1._5_1_ = rep[1].storage[0];
  lVar1._6_1_ = rep[1].storage[1];
  lVar1._7_1_ = rep[1].storage[2];
  if (lVar1 != 0) {
    (**(code **)&rep[1].refcount)(rep);
    return;
  }
  __assert_fail("rep_external->releaser_invoker != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/cord_internal.h"
                ,0x1b7,"static void absl::cord_internal::CordRepExternal::Delete(CordRep *)");
}

Assistant:

inline void CordRepExternal::Delete(CordRep* rep) {
  assert(rep != nullptr && rep->IsExternal());
  auto* rep_external = static_cast<CordRepExternal*>(rep);
  assert(rep_external->releaser_invoker != nullptr);
  rep_external->releaser_invoker(rep_external);
}